

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

void SUNDlsMat_SetToZero(SUNDlsMat A)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  realtype *prVar5;
  realtype *col_j;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  SUNDlsMat A_local;
  
  if (A->type == 1) {
    for (j = 0; j < A->N; j = j + 1) {
      prVar5 = A->cols[j];
      for (i = 0; i < A->M; i = i + 1) {
        prVar5[i] = 0.0;
      }
    }
  }
  else if (A->type == 2) {
    iVar1 = A->mu;
    iVar2 = A->ml;
    for (j = 0; j < A->M; j = j + 1) {
      prVar5 = A->cols[j];
      iVar3 = A->s_mu;
      iVar4 = A->mu;
      for (i = 0; i < iVar1 + iVar2 + 1; i = i + 1) {
        prVar5[(long)iVar3 + ((long)i - (long)iVar4)] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SUNDlsMat_SetToZero(SUNDlsMat A)
{
  sunindextype i, j, colSize;
  realtype *col_j;

  switch (A->type) {

  case SUNDIALS_DENSE:

    for (j=0; j<A->N; j++) {
      col_j = A->cols[j];
      for (i=0; i<A->M; i++)
        col_j[i] = ZERO;
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j=0; j<A->M; j++) {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i=0; i<colSize; i++)
        col_j[i] = ZERO;
    }

    break;

  }

}